

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

void __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::_M_erase_bucket(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
                  *this,size_type __n,_Node *__first,_Node *__last)

{
  reference pp_Var1;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *local_38;
  _Node *__next;
  _Node *__cur;
  _Node *__last_local;
  _Node *__first_local;
  size_type __n_local;
  hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  
  pp_Var1 = std::
            vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ::operator[](&this->_M_buckets,__n);
  __next = *pp_Var1;
  if (__next == __first) {
    _M_erase_bucket(this,__n,__last);
  }
  else {
    for (local_38 = __next->_M_next; local_38 != __first; local_38 = local_38->_M_next) {
      __next = local_38;
    }
    while (local_38 != __last) {
      __next->_M_next = local_38->_M_next;
      _M_delete_node(this,local_38);
      local_38 = __next->_M_next;
      this->_M_num_elements = this->_M_num_elements - 1;
    }
  }
  return;
}

Assistant:

void hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>
  ::_M_erase_bucket(const size_type __n, _Node* __first, _Node* __last)
{
  _Node* __cur = _M_buckets[__n];
  if (__cur == __first)
    _M_erase_bucket(__n, __last);
  else {
    _Node* __next;
    for (__next = __cur->_M_next;
         __next != __first;
         __cur = __next, __next = __cur->_M_next)
      ;
    while (__next != __last) {
      __cur->_M_next = __next->_M_next;
      _M_delete_node(__next);
      __next = __cur->_M_next;
      --_M_num_elements;
    }
  }
}